

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall
presolve::HPresolve::transformColumn
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt col,double scale,
          double constant)

{
  double dVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  HighsLp *pHVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer piVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  pointer piVar12;
  HighsInt *pHVar13;
  long lVar14;
  double *pdVar15;
  double dVar16;
  int local_50;
  
  if (this->mipsolver != (HighsMipSolver *)0x0) {
    HighsImplications::columnTransformed
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->implications,col
               ,scale,constant);
  }
  HighsPostsolveStack::linearTransform(postsolve_stack,col,scale,constant);
  if ((constant != 0.0) || (NAN(constant))) {
    pdVar3 = (this->model->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->model->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar16 = pdVar3[col];
    dVar1 = pdVar4[col];
    pdVar4[col] = dVar1 - constant;
    pdVar3[col] = pdVar3[col] - constant;
    piVar12 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar14 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[col];
    if (lVar14 == -1) {
      uVar11 = 0xffffffff;
    }
    else {
      pdVar15 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar14;
      pHVar13 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + lVar14;
      do {
        HighsLinearSumBounds::updatedVarLower(&this->impliedRowBounds,*pHVar13,col,*pdVar15,dVar16);
        HighsLinearSumBounds::updatedVarUpper(&this->impliedRowBounds,*pHVar13,col,*pdVar15,dVar1);
        lVar9 = (long)(int)lVar14;
        lVar14 = (long)piVar12[lVar9];
        pHVar13 = pHVar13 + (lVar14 - lVar9);
        pdVar15 = pdVar15 + (lVar14 - lVar9);
      } while (lVar14 != -1);
      piVar12 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar11 = (ulong)(uint)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[col];
    }
    pdVar3 = (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar16 = pdVar3[col];
    dVar1 = pdVar4[col];
    pdVar3[col] = dVar16 - constant;
    pdVar4[col] = pdVar4[col] - constant;
    iVar10 = (int)uVar11;
    if (iVar10 != -1) {
      pdVar15 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + iVar10;
      pHVar13 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + iVar10;
      do {
        HighsLinearSumBounds::updatedImplVarLower
                  (&this->impliedRowBounds,*pHVar13,col,*pdVar15,dVar16,
                   (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[col]);
        HighsLinearSumBounds::updatedImplVarUpper
                  (&this->impliedRowBounds,*pHVar13,col,*pdVar15,dVar1,
                   (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[col]);
        local_50 = (int)uVar11;
        lVar14 = (long)local_50;
        uVar11 = (ulong)piVar12[lVar14];
        pHVar13 = pHVar13 + (uVar11 - lVar14);
        pdVar15 = pdVar15 + (uVar11 - lVar14);
      } while (uVar11 != 0xffffffffffffffff);
    }
  }
  HighsLinearSumBounds::sumScaled(&this->impliedDualRowBounds,col,scale);
  dVar16 = 1.0 / scale;
  pHVar5 = this->model;
  pdVar3 = (pHVar5->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3[col] = pdVar3[col] * dVar16;
  pdVar4 = (pHVar5->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4[col] = pdVar4[col] * dVar16;
  pdVar6 = (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6[col] = pdVar6[col] * dVar16;
  pdVar7 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7[col] = dVar16 * pdVar7[col];
  if (scale < 0.0) {
    dVar16 = pdVar3[col];
    pdVar3[col] = pdVar4[col];
    pdVar4[col] = dVar16;
    dVar16 = pdVar6[col];
    pdVar6[col] = pdVar7[col];
    pdVar7[col] = dVar16;
    piVar12 = (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar8 = (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = piVar12[col];
    piVar12[col] = piVar8[col];
    piVar8[col] = iVar10;
  }
  pdVar4 = (pHVar5->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar5->offset_ = pdVar4[col] * constant + pHVar5->offset_;
  pdVar4[col] = pdVar4[col] * scale;
  iVar10 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[col];
  if (iVar10 != -1) {
    pdVar4 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar12 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar6 = (pHVar5->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (pHVar5->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      dVar16 = pdVar4[iVar10];
      pdVar4[iVar10] = dVar16 * scale;
      iVar2 = piVar12[iVar10];
      dVar16 = dVar16 * constant;
      dVar1 = pdVar6[iVar2];
      if (-INFINITY < dVar1) {
        pdVar6[iVar2] = dVar1 - dVar16;
      }
      dVar1 = pdVar7[iVar2];
      if (dVar1 < INFINITY) {
        pdVar7[iVar2] = dVar1 - dVar16;
      }
      iVar10 = piVar8[iVar10];
    } while (iVar10 != -1);
  }
  if ((pHVar5->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
      .super__Vector_impl_data._M_start[col] != kContinuous) {
    changeColLower(this,col,pdVar3[col]);
    changeColUpper(this,col,(this->model->col_upper_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[col]);
  }
  markChangedCol(this,col);
  return;
}

Assistant:

void HPresolve::transformColumn(HighsPostsolveStack& postsolve_stack,
                                HighsInt col, double scale, double constant) {
  // replace column x by x = scale * x' + constant
  if (mipsolver != nullptr)
    mipsolver->mipdata_->implications.columnTransformed(col, scale, constant);

  postsolve_stack.linearTransform(col, scale, constant);

  // new variable x' has the following bounds:
  // scale > 0 --> (lb - constant) / scale <= x' <= (ub - constant) / scale
  // scale < 0 --> (ub - constant) / scale <= x' <= (lb - constant) / scale
  // each matrix coefficient a will be replaced by scale * a and, therefore, the
  // contributions to the constraint activities will change as follows:
  // a * lb --> (a * scale) * (lb - constant) / scale = a * (lb - constant)
  // a * ub --> (a * scale) * (ub - constant) / scale = a * (ub - constant).
  // therefore, for now the scaling can be neglected and the bounds on
  // constraint activities can be updated using the constant term.
  if (constant != 0.0) {
    double oldLower = model->col_lower_[col];
    double oldUpper = model->col_upper_[col];
    model->col_upper_[col] -= constant;
    model->col_lower_[col] -= constant;

    for (const HighsSliceNonzero& nonzero : getColumnVector(col)) {
      impliedRowBounds.updatedVarLower(nonzero.index(), col, nonzero.value(),
                                       oldLower);
      impliedRowBounds.updatedVarUpper(nonzero.index(), col, nonzero.value(),
                                       oldUpper);
    }

    double oldImplLower = implColLower[col];
    double oldImplUpper = implColUpper[col];
    implColLower[col] -= constant;
    implColUpper[col] -= constant;

    for (const HighsSliceNonzero& nonzero : getColumnVector(col)) {
      impliedRowBounds.updatedImplVarLower(nonzero.index(), col,
                                           nonzero.value(), oldImplLower,
                                           colLowerSource[col]);
      impliedRowBounds.updatedImplVarUpper(nonzero.index(), col,
                                           nonzero.value(), oldImplUpper,
                                           colUpperSource[col]);
    }
  }

  // now apply the scaling, which does not change the contributions to the
  // implied row bounds, but requires adjusting the implied bounds of the
  // columns dual constraint
  impliedDualRowBounds.sumScaled(col, scale);

  double boundScale = 1.0 / scale;
  model->col_lower_[col] *= boundScale;
  model->col_upper_[col] *= boundScale;
  implColLower[col] *= boundScale;
  implColUpper[col] *= boundScale;

  if (scale < 0) {
    std::swap(model->col_lower_[col], model->col_upper_[col]);
    std::swap(implColLower[col], implColUpper[col]);
    std::swap(colLowerSource[col], colUpperSource[col]);
  }

  model->offset_ += model->col_cost_[col] * constant;
  model->col_cost_[col] *= scale;

  for (HighsInt coliter = colhead[col]; coliter != -1;
       coliter = Anext[coliter]) {
    double val = Avalue[coliter];
    Avalue[coliter] *= scale;
    HighsInt row = Arow[coliter];
    double rowConstant = val * constant;
    if (model->row_lower_[row] != -kHighsInf)
      model->row_lower_[row] -= rowConstant;
    if (model->row_upper_[row] != kHighsInf)
      model->row_upper_[row] -= rowConstant;
  }

  // finally, use utility methods for rounding scaled bounds of
  // integer-constrained variables and updating bounds on constraint activities
  // accordingly. this should not be done before the preceding bound updates
  // (scaling and swaps) and matrix updates. we rely on the integrality status
  // being already updated to the newly scaled column by the caller, if
  // necessary.
  if (model->integrality_[col] != HighsVarType::kContinuous) {
    changeColLower(col, model->col_lower_[col]);
    changeColUpper(col, model->col_upper_[col]);
  }

  markChangedCol(col);
}